

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O0

void __thiscall
Statsd::StatsdClient::send<double>
          (StatsdClient *this,string *key,double value,char *type,float frequency,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  long lVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  float fVar2;
  bool bVar3;
  pointer pUVar4;
  float *pfVar5;
  ostream *poVar6;
  ulong uVar7;
  void *__buf;
  int in_R8D;
  long *in_FS_OFFSET;
  result_type_conflict1 rVar8;
  double dVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_200 [36];
  int local_1dc;
  stringstream local_1d8 [8];
  stringstream valueStream;
  ostream local_1c8 [376];
  uniform_real_distribution<float> local_50;
  undefined1 local_46;
  byte local_45;
  undefined4 local_44;
  bool isFrequencyZero;
  float fStack_40;
  bool isFrequencyOne;
  float epsilon;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags_local;
  char *pcStack_28;
  float frequency_local;
  char *type_local;
  double value_local;
  string *key_local;
  StatsdClient *this_local;
  
  local_38 = tags;
  tags_local._4_4_ = frequency;
  pcStack_28 = type;
  type_local = (char *)value;
  value_local = (double)key;
  key_local = &this->m_prefix;
  pUVar4 = std::unique_ptr<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>::operator->
                     (&this->m_sender);
  bVar3 = UDPSender::initialized(pUVar4);
  if (bVar3) {
    epsilon = 1.0;
    pfVar5 = std::min<float>((float *)((long)&tags_local + 4),&epsilon);
    fStack_40 = 0.0;
    pfVar5 = std::max<float>(pfVar5,&stack0xffffffffffffffc0);
    tags_local._4_4_ = *pfVar5;
    local_44 = 0x38d1b717;
    dVar9 = std::fabs((double)(ulong)(uint)(tags_local._4_4_ - 1.0));
    local_45 = SUB84(dVar9,0) < 0.0001;
    dVar9 = std::fabs((double)(ulong)(uint)tags_local._4_4_);
    fVar2 = tags_local._4_4_;
    local_46 = SUB84(dVar9,0) < 0.0001;
    bVar3 = true;
    if ((!(bool)local_46) && (bVar3 = false, (local_45 & 1) == 0)) {
      std::uniform_real_distribution<float>::uniform_real_distribution(&local_50,0.0,1.0);
      rVar8 = std::uniform_real_distribution<float>::operator()(&local_50,&this->m_randomEngine);
      bVar3 = fVar2 < rVar8;
    }
    if (!bVar3) {
      std::__cxx11::stringstream::stringstream(local_1d8);
      poVar6 = (ostream *)std::ostream::operator<<(local_1c8,std::fixed);
      local_1dc = (int)std::setprecision(this->m_gaugePrecision);
      poVar6 = std::operator<<(poVar6,(_Setprecision)local_1dc);
      std::ostream::operator<<(poVar6,(double)type_local);
      if ((char)in_FS_OFFSET[-1] == '\0') {
        lVar1 = *in_FS_OFFSET;
        std::__cxx11::string::string((string *)(lVar1 + -0x28));
        __cxa_thread_atexit(std::__cxx11::string::~string,(string *)(lVar1 + -0x28),&__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      lVar1 = *in_FS_OFFSET;
      std::__cxx11::string::clear();
      std::__cxx11::string::reserve(lVar1 - 0x28);
      std::__cxx11::string::append((string *)(*in_FS_OFFSET + -0x28));
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
        std::__cxx11::string::push_back((char)*in_FS_OFFSET + -0x28);
      }
      std::__cxx11::string::append((string *)(*in_FS_OFFSET + -0x28));
      std::__cxx11::string::push_back((char)*in_FS_OFFSET + -0x28);
      lVar1 = *in_FS_OFFSET;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::append((string *)(lVar1 + -0x28));
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::push_back((char)*in_FS_OFFSET + -0x28);
      std::__cxx11::string::append((char *)(*in_FS_OFFSET + -0x28));
      if (tags_local._4_4_ < 1.0) {
        std::__cxx11::string::append((char *)(*in_FS_OFFSET + -0x28));
        lVar1 = *in_FS_OFFSET;
        std::__cxx11::to_string((__cxx11 *)&__range3,(int)(tags_local._4_4_ * 100.0));
        std::__cxx11::string::append((string *)(lVar1 + -0x28));
        std::__cxx11::string::~string((string *)&__range3);
      }
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(local_38);
      if (!bVar3) {
        std::__cxx11::string::append((char *)(*in_FS_OFFSET + -0x28));
        this_00 = local_38;
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(local_38);
        tag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_00);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&tag), bVar3) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end3);
          std::__cxx11::string::append((string *)(*in_FS_OFFSET + -0x28));
          std::__cxx11::string::push_back((char)*in_FS_OFFSET + -0x28);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::__cxx11::string::pop_back();
      }
      pUVar4 = std::unique_ptr<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>::
               operator->(&this->m_sender);
      UDPSender::send(pUVar4,(int)*in_FS_OFFSET + -0x28,__buf,(size_t)tags,in_R8D);
      std::__cxx11::stringstream::~stringstream(local_1d8);
    }
  }
  return;
}

Assistant:

inline void StatsdClient::send(const std::string& key,
                               const T value,
                               const char* type,
                               float frequency,
                               const std::vector<std::string>& tags) const noexcept {
    // Bail if we can't send anything anyway
    if (!m_sender->initialized()) {
        return;
    }

    // A valid frequency is: 0 <= f <= 1
    // At 0 you never emit the stat, at 1 you always emit the stat and with anything else you roll the dice
    frequency = std::max(std::min(frequency, 1.f), 0.f);
    constexpr float epsilon{0.0001f};
    const bool isFrequencyOne = std::fabs(frequency - 1.0f) < epsilon;
    const bool isFrequencyZero = std::fabs(frequency) < epsilon;
    if (isFrequencyZero ||
        (!isFrequencyOne && (frequency < std::uniform_real_distribution<float>(0.f, 1.f)(m_randomEngine)))) {
        return;
    }

    // Format the stat message
    std::stringstream valueStream;
    valueStream << std::fixed << std::setprecision(m_gaugePrecision) << value;

    // the thread keeps this buffer around and reuses it, clear should be O(1)
    // and reserve should only have to do so the first time, after that, it's a no-op
    static thread_local std::string buffer;
    buffer.clear();
    buffer.reserve(256);

    buffer.append(m_prefix);
    if (!m_prefix.empty() && !key.empty()) {
        buffer.push_back('.');
    }

    buffer.append(key);
    buffer.push_back(':');
    buffer.append(valueStream.str());
    buffer.push_back('|');
    buffer.append(type);

    if (frequency < 1.f) {
        buffer.append("|@0.");
        buffer.append(std::to_string(static_cast<int>(frequency * 100)));
    }

    if (!tags.empty()) {
        buffer.append("|#");
        for (const auto& tag : tags) {
            buffer.append(tag);
            buffer.push_back(',');
        }
        buffer.pop_back();
    }

    // Send the message via the UDP sender
    m_sender->send(buffer);
}